

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

HullError __thiscall
ConvexDecomposition::HullLibrary::CreateConvexHull
          (HullLibrary *this,HullDesc *desc,HullResult *result)

{
  uint uVar1;
  uint *__src;
  bool bVar2;
  ulong uVar3;
  float *vertices;
  uint *puVar4;
  uint *puVar5;
  long lVar6;
  uint *puVar7;
  ulong uVar8;
  uint uVar9;
  HullError HVar10;
  HullLibrary *pHVar11;
  uint uVar12;
  uint ovcount;
  PHullResult hr;
  float scale [3];
  uint local_84;
  float *local_80;
  size_t local_78;
  float *local_70;
  HullResult *local_68;
  PHullResult local_60;
  float local_3c;
  float local_38;
  float local_34;
  
  local_60.mVcount = 0;
  local_60.mIndexCount = 0;
  local_60.mFaceCount = 0;
  local_60.mVertices = (float *)0x0;
  local_60.mIndices = (uint *)0x0;
  uVar1 = desc->mVcount;
  uVar3 = 8;
  if (8 < uVar1) {
    uVar3 = (ulong)uVar1;
  }
  pHVar11 = (HullLibrary *)(uVar3 * 0xc);
  vertices = (float *)malloc((size_t)pHVar11);
  bVar2 = CleanupVertices(pHVar11,uVar1,desc->mVertices,desc->mVertexStride,&local_84,vertices,
                          desc->mNormalEpsilon,&local_3c);
  HVar10 = QE_FAIL;
  if (bVar2) {
    if ((ulong)local_84 != 0) {
      uVar3 = 0;
      do {
        uVar8 = uVar3 & 0xffffffff;
        vertices[uVar8] = local_3c * vertices[uVar8];
        vertices[uVar8 + 1] = local_38 * vertices[uVar8 + 1];
        vertices[uVar8 + 2] = local_34 * vertices[uVar8 + 2];
        uVar3 = uVar3 + 3;
      } while ((ulong)local_84 * 3 != uVar3);
    }
    bVar2 = ComputeHull(local_84,vertices,&local_60,desc->mMaxVertices,
                        (float)((uint)((desc->mFlags & 4) != 0) * (int)desc->mSkinWidth));
    if (bVar2) {
      uVar1 = local_60.mVcount;
      pHVar11 = (HullLibrary *)((local_60._0_8_ & 0xffffffff) * 0xc);
      local_70 = (float *)malloc((size_t)pHVar11);
      __src = local_60.mIndices;
      uVar9 = local_60.mIndexCount;
      uVar3 = (ulong)local_60.mIndexCount;
      BringOutYourDead(pHVar11,local_60.mVertices,uVar1,local_70,&local_84,local_60.mIndices,
                       local_60.mIndexCount);
      uVar1 = desc->mFlags;
      local_68 = result;
      if ((uVar1 & 1) == 0) {
        result->mPolygons = true;
        result->mNumOutputVertices = local_84;
        local_78 = (ulong)local_84 * 0xc;
        local_80 = (float *)malloc(local_78);
        uVar12 = local_60.mFaceCount;
        result->mOutputVertices = local_80;
        result->mNumFaces = local_60.mFaceCount;
        uVar9 = uVar9 + local_60.mFaceCount;
        result->mNumIndices = uVar9;
        puVar4 = (uint *)malloc((ulong)uVar9 << 2);
        local_68->mIndices = puVar4;
        memcpy(local_80,local_70,local_78);
        if (uVar12 != 0) {
          puVar4 = puVar4 + 2;
          puVar5 = __src;
          do {
            puVar4[-2] = 3;
            if ((uVar1 & 2) == 0) {
              puVar4[-1] = *puVar5;
              *puVar4 = puVar5[1];
              puVar7 = puVar5 + 2;
            }
            else {
              puVar4[-1] = puVar5[2];
              *puVar4 = puVar5[1];
              puVar7 = puVar5;
            }
            puVar4[1] = *puVar7;
            puVar5 = puVar5 + 3;
            puVar4 = puVar4 + 4;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
      }
      else {
        result->mPolygons = false;
        result->mNumOutputVertices = local_84;
        local_78 = (ulong)local_84 * 0xc;
        local_80 = (float *)malloc(local_78);
        uVar12 = local_60.mFaceCount;
        result->mOutputVertices = local_80;
        result->mNumFaces = local_60.mFaceCount;
        result->mNumIndices = uVar9;
        puVar4 = (uint *)malloc(uVar3 * 4);
        local_68->mIndices = puVar4;
        memcpy(local_80,local_70,local_78);
        if ((uVar1 & 2) == 0) {
          memcpy(puVar4,__src,uVar3 * 4);
        }
        else if (uVar12 != 0) {
          lVar6 = 0;
          do {
            *(undefined4 *)((long)puVar4 + lVar6) = *(undefined4 *)((long)__src + lVar6 + 8);
            *(undefined4 *)((long)puVar4 + lVar6 + 4) = *(undefined4 *)((long)__src + lVar6 + 4);
            *(undefined4 *)((long)puVar4 + lVar6 + 8) = *(undefined4 *)((long)__src + lVar6);
            lVar6 = lVar6 + 0xc;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
      }
      if (__src != (uint *)0x0) {
        free(__src);
      }
      local_60.mVcount = 0;
      local_60.mIndexCount = 0;
      local_60.mVertices = (float *)0x0;
      local_60.mIndices = (uint *)0x0;
      HVar10 = QE_OK;
      if (local_70 != (float *)0x0) {
        free(local_70);
        HVar10 = QE_OK;
      }
    }
  }
  if (vertices != (float *)0x0) {
    free(vertices);
  }
  return HVar10;
}

Assistant:

HullError HullLibrary::CreateConvexHull(const HullDesc       &desc,           // describes the input request
																					HullResult           &result)         // contains the resulst
{
	HullError ret = QE_FAIL;


	PHullResult hr;

	unsigned int vcount = desc.mVcount;
	if ( vcount < 8 ) vcount = 8;

	float *vsource  = (float *) malloc( sizeof(float)*vcount*3);


	float scale[3];

	unsigned int ovcount;

	bool ok = CleanupVertices(desc.mVcount,desc.mVertices, desc.mVertexStride, ovcount, vsource, desc.mNormalEpsilon, scale ); // normalize point cloud, remove duplicates!

	if ( ok )
	{


		if ( 1 ) // scale vertices back to their original size.
		{
			for (unsigned int i=0; i<ovcount; i++)
			{
				float *v = &vsource[i*3];
				v[0]*=scale[0];
				v[1]*=scale[1];
				v[2]*=scale[2];
			}
		}

		float skinwidth = 0;
		if ( desc.HasHullFlag(QF_SKIN_WIDTH) )
			skinwidth = desc.mSkinWidth;

		ok = ComputeHull(ovcount,vsource,hr,desc.mMaxVertices,skinwidth);

		if ( ok )
		{

			// re-index triangle mesh so it refers to only used vertices, rebuild a new vertex table.
			float *vscratch = (float *) malloc( sizeof(float)*hr.mVcount*3);
			BringOutYourDead(hr.mVertices,hr.mVcount, vscratch, ovcount, hr.mIndices, hr.mIndexCount );

			ret = QE_OK;

			if ( desc.HasHullFlag(QF_TRIANGLES) ) // if he wants the results as triangle!
			{
				result.mPolygons          = false;
				result.mNumOutputVertices = ovcount;
				result.mOutputVertices    = (float *)malloc( sizeof(float)*ovcount*3);
				result.mNumFaces          = hr.mFaceCount;
				result.mNumIndices        = hr.mIndexCount;

				result.mIndices           = (unsigned int *) malloc( sizeof(unsigned int)*hr.mIndexCount);

				memcpy(result.mOutputVertices, vscratch, sizeof(float)*3*ovcount );

  			if ( desc.HasHullFlag(QF_REVERSE_ORDER) )
				{

					const unsigned int *source = hr.mIndices;
								unsigned int *dest   = result.mIndices;

					for (unsigned int i=0; i<hr.mFaceCount; i++)
					{
						dest[0] = source[2];
						dest[1] = source[1];
						dest[2] = source[0];
						dest+=3;
						source+=3;
					}

				}
				else
				{
					memcpy(result.mIndices, hr.mIndices, sizeof(unsigned int)*hr.mIndexCount);
				}
			}
			else
			{
				result.mPolygons          = true;
				result.mNumOutputVertices = ovcount;
				result.mOutputVertices    = (float *)malloc( sizeof(float)*ovcount*3);
				result.mNumFaces          = hr.mFaceCount;
				result.mNumIndices        = hr.mIndexCount+hr.mFaceCount;
				result.mIndices           = (unsigned int *) malloc( sizeof(unsigned int)*result.mNumIndices);
				memcpy(result.mOutputVertices, vscratch, sizeof(float)*3*ovcount );

				if ( 1 )
				{
					const unsigned int *source = hr.mIndices;
								unsigned int *dest   = result.mIndices;
					for (unsigned int i=0; i<hr.mFaceCount; i++)
					{
						dest[0] = 3;
						if ( desc.HasHullFlag(QF_REVERSE_ORDER) )
						{
							dest[1] = source[2];
							dest[2] = source[1];
							dest[3] = source[0];
						}
						else
						{
							dest[1] = source[0];
							dest[2] = source[1];
							dest[3] = source[2];
						}

						dest+=4;
						source+=3;
					}
				}
			}
			ReleaseHull(hr);
			if ( vscratch )
			{
				free(vscratch);
			}
		}
	}

	if ( vsource )
	{
		free(vsource);
	}


	return ret;
}